

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  int in_EDX;
  vector<crnlib::symbol_codec::output_symbol> *in_RDI;
  output_symbol sym;
  output_symbol *in_stack_ffffffffffffffd8;
  
  if ((in_EDX != 0) &&
     (in_RDI[7].m_size = in_EDX + in_RDI[7].m_size, (in_RDI[7].m_capacity & 1) == 0)) {
    vector<crnlib::symbol_codec::output_symbol>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void symbol_codec::record_put_bits(uint bits, uint num_bits) {
  CRNLIB_ASSERT(m_mode == cEncoding);

  CRNLIB_ASSERT(num_bits <= 25);
  CRNLIB_ASSERT(m_bit_count >= 25);

  if (!num_bits)
    return;

  m_total_bits_written += num_bits;

  if (!m_simulate_encoding) {
    output_symbol sym;
    sym.m_bits = bits;
    sym.m_num_bits = (uint16)num_bits;
    sym.m_arith_prob0 = 0;
    m_output_syms.push_back(sym);
  }
}